

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac_vs_dss.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  rep rVar4;
  rep rVar5;
  int rank;
  timer t;
  vector<unsigned_long,_std::allocator<unsigned_long>_> SA;
  string input_str;
  int argc_local;
  timer t_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> glSA;
  char **argv_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  string local_str;
  SwitchArg checkArg;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  sa;
  ValueArg<int> seedArg;
  ValueArg<unsigned_long> randArg;
  CmdLine cmd;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fileArg
  ;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  std::__cxx11::string::string
            ((string *)&sa,"Compare our parallel implementation with divsufsort.",
             (allocator *)&fileArg);
  std::__cxx11::string::string((string *)&local_str,"none",(allocator *)&randArg);
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&sa,' ',&local_str,true);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  std::__cxx11::string::string((string *)&sa,"f",(allocator *)&checkArg);
  std::__cxx11::string::string((string *)&local_str,"file",(allocator *)&input_str);
  std::__cxx11::string::string((string *)&randArg,"Input filename.",(allocator *)&SA);
  std::__cxx11::string::string((string *)&local_820,"",(allocator *)&glSA);
  std::__cxx11::string::string((string *)&seedArg,"filename",(allocator *)&t);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&fileArg,(string *)&sa,&local_str,(string *)&randArg,true,&local_820,(string *)&seedArg
             ,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&seedArg);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&randArg);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  std::__cxx11::string::string((string *)&sa,"r",(allocator *)&input_str);
  std::__cxx11::string::string((string *)&local_str,"random",(allocator *)&SA);
  std::__cxx11::string::string((string *)&seedArg,"Random input size",(allocator *)&glSA);
  std::__cxx11::string::string((string *)&checkArg,"size",(allocator *)&t);
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&randArg,(string *)&sa,&local_str,(string *)&seedArg,true,0,(string *)&checkArg,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&checkArg);
  std::__cxx11::string::~string((string *)&seedArg);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  std::__cxx11::string::string((string *)&sa,"s",(allocator *)&SA);
  std::__cxx11::string::string((string *)&local_str,"seed",(allocator *)&glSA);
  std::__cxx11::string::string
            ((string *)&checkArg,"Sets the seed for the ranom input generation",(allocator *)&t);
  std::__cxx11::string::string((string *)&input_str,"int",(allocator *)&t_2);
  TCLAP::ValueArg<int>::ValueArg
            (&seedArg,(string *)&sa,&local_str,(string *)&checkArg,false,0,&input_str,(Visitor *)0x0
            );
  std::__cxx11::string::~string((string *)&input_str);
  std::__cxx11::string::~string((string *)&checkArg);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&seedArg);
  TCLAP::CmdLine::xorAdd(&cmd,&fileArg.super_Arg,&randArg.super_Arg);
  std::__cxx11::string::string((string *)&sa,"c",(allocator *)&SA);
  std::__cxx11::string::string((string *)&local_str,"check",(allocator *)&glSA);
  std::__cxx11::string::string
            ((string *)&input_str,"Check correctness of SA for PSAC using divsufsort `sufcheck()`.",
             (allocator *)&t);
  TCLAP::SwitchArg::SwitchArg(&checkArg,(string *)&sa,&local_str,&input_str,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&input_str);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&checkArg);
  TCLAP::CmdLine::parse(&cmd,argc_local,argv_local);
  input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
  input_str._M_string_length = 0;
  input_str.field_2._M_local_buf[0] = '\0';
  if (rank == 0) {
    bVar1 = std::operator!=(&fileArg._value,"");
    if (bVar1) {
      std::ifstream::ifstream(&sa,fileArg._value._M_dataplus._M_p,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_str);
      std::ostream::operator<<(&local_str.field_2,(streambuf *)&sa.local_size);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&input_str,(string *)&SA);
      std::__cxx11::string::~string((string *)&SA);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_str);
      std::ifstream::~ifstream(&sa);
    }
    else {
      rand_dna_abi_cxx11_((string *)&sa,randArg._value,seedArg.super_Arg._164_4_);
      std::__cxx11::string::operator=((string *)&input_str,(string *)&sa);
      std::__cxx11::string::~string((string *)&sa);
    }
  }
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm((comm *)&sa,(MPI_Comm *)&SA);
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::stable_distribute(&local_str,&input_str,(comm *)&sa);
  mxx::comm::~comm((comm *)&sa);
  t.start.__d.__r = (time_point)(duration)0x0;
  t.start.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
  rVar4 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t);
  glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm((comm *)&SA,(MPI_Comm *)&glSA);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::suffix_array(&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_str._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_str._M_dataplus._M_p + local_str._M_string_length),(comm *)&SA);
  mxx::comm::~comm((comm *)&SA);
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
  construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                      *)&sa,true);
  rVar5 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t);
  if (rank == 0) {
    std::operator<<((ostream *)&std::cerr,"PSAC time: ");
    poVar3 = std::ostream::_M_insert<double>(rVar5 - rVar4);
    poVar3 = std::operator<<(poVar3," ms");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  mxx::comm::comm((comm *)&SA);
  mxx::gatherv<unsigned_long>(&glSA,&sa.local_SA,0,(comm *)&SA);
  mxx::comm::~comm((comm *)&SA);
  bVar1 = true;
  if (rank == 0) {
    t_2.start.__d.__r = (time_point)(duration)0x0;
    t_2.start.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
    SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rVar4 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t_2);
    dss::construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )input_str._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(input_str._M_dataplus._M_p + input_str._M_string_length),&SA);
    rVar5 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t_2);
    std::operator<<((ostream *)&std::cerr,"divsufsort time: ");
    poVar3 = std::ostream::_M_insert<double>(rVar5 - rVar4);
    poVar3 = std::operator<<(poVar3," ms");
    std::endl<char,std::char_traits<char>>(poVar3);
    if (checkArg.super_Arg._163_1_ == '\x01') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Checking for correctness...");
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar2 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )input_str._M_dataplus._M_p,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(input_str._M_dataplus._M_p + input_str._M_string_length),&glSA);
      if (!bVar2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: wrong suffix array from PSAC");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        bVar1 = false;
        goto LAB_00120124;
      }
      bVar2 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )input_str._M_dataplus._M_p,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(input_str._M_dataplus._M_p + input_str._M_string_length),&SA);
      if (!bVar2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: wrong suffix array from divsufsort");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
LAB_00120124:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::~suffix_array(&sa);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&input_str);
  TCLAP::Arg::~Arg(&checkArg.super_Arg);
  TCLAP::ValueArg<int>::~ValueArg(&seedArg);
  TCLAP::ValueArg<unsigned_long>::~ValueArg(&randArg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&fileArg);
  TCLAP::CmdLine::~CmdLine(&cmd);
  if (bVar1) {
    MPI_Finalize();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // set up MPI
    MPI_Init(&argc, &argv);
    int rank;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Compare our parallel implementation with divsufsort.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    cmd.xorAdd(fileArg, randArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA for PSAC using divsufsort `sufcheck()`.", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    std::string input_str;
    if (rank == 0) {
        if (fileArg.getValue() != "") {
            std::ifstream t(fileArg.getValue().c_str());
            std::stringstream buffer;
            buffer << t.rdbuf();
            input_str = buffer.str();
        } else {
            input_str = rand_dna(randArg.getValue(), seedArg.getValue());
        }
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    std::string local_str = mxx::stable_distribute(input_str, MPI_COMM_WORLD);
    mxx::timer t;
    double start = t.elapsed();
    suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
    // TODO: choose construction method!
    sa.construct_arr<2>(true);
    //sa.construct_arr<2>();
    double end = t.elapsed() - start;
    if (rank == 0)
        std::cerr << "PSAC time: " << end << " ms" << std::endl;
    std::vector<index_t> glSA = mxx::gatherv(sa.local_SA, 0);


    // run construction with divsufsort locally on rank 0
    if (rank == 0) {
        mxx::timer t;
        std::vector<index_t> SA;
        double start = t.elapsed();
        dss::construct(input_str.begin(), input_str.end(), SA);
        double end = t.elapsed() - start;
        std::cerr << "divsufsort time: " << end << " ms" << std::endl;

        // check correctness if we should do so!
        if (checkArg.getValue()) {
            std::cerr << "Checking for correctness..." << std::endl;
            if(!dss::check(input_str.begin(), input_str.end(), glSA)) {
                std::cerr << "ERROR: wrong suffix array from PSAC" << std::endl;
                return false;
            }
            if(!dss::check(input_str.begin(), input_str.end(), SA)) {
                std::cerr << "ERROR: wrong suffix array from divsufsort" << std::endl;
            }
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    MPI_Finalize();

    return 0;
}